

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O2

int update_lib_bindings(Elf64_Sym *symbol,char *name,Elf64_Addr offset,link_map *lmap,
                       hash_table_t *lookuptable)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  internal_binding_t *internal_binding;
  
  internal_binding = (internal_binding_t *)0x0;
  iVar2 = lookup_hashtable((hash_table_t *)lmap,symbol,&internal_binding);
  if (iVar2 == 0) {
    *(void **)(name + *(long *)offset) = internal_binding->user_binding->wrapper_pointer;
    __stream = _stderr;
    iVar2 = 0x29bbd4;
    if (2 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      pcVar1 = *(char **)(offset + 8);
      if (pcVar1 == (char *)0x0) {
        pcVar5 = "[NULL]";
      }
      else {
        pcVar5 = "[EMPTY]";
        if (*pcVar1 != '\0') {
          pcVar5 = pcVar1;
        }
      }
      iVar2 = fprintf(__stream,
                      "[%d/%d][%s:%u] - Remapped call to %s at 0x%lx in %s to wrapper at 0x%p\n",
                      (ulong)uVar3,(ulong)uVar4,"gotcha.c",0xde,symbol,name + *(long *)offset,pcVar5
                      ,internal_binding->user_binding->wrapper_pointer);
    }
  }
  return iVar2;
}

Assistant:

static int update_lib_bindings(ElfW(Sym) * symbol KNOWN_UNUSED, char *name,
                               ElfW(Addr) offset, struct link_map *lmap,
                               hash_table_t *lookuptable) {
  int result = 0;
  struct internal_binding_t *internal_binding = NULL;
  void **got_address = NULL;

  result = lookup_hashtable(lookuptable, name, (void **)&internal_binding);
  if (result != 0) return -1;
  got_address = (void **)(lmap->l_addr + offset);
  writeAddress(got_address, internal_binding->user_binding->wrapper_pointer);
  debug_printf(3, "Remapped call to %s at 0x%lx in %s to wrapper at 0x%p\n",
               name, (lmap->l_addr + offset), LIB_NAME(lmap),
               internal_binding->user_binding->wrapper_pointer);
  return 0;
}